

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTUINTDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  octet oVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  size_t l;
  u32 t;
  size_t local_40;
  u32 local_34;
  
  sVar2 = derTLDec(&local_34,&local_40,der,count);
  sVar3 = 0xffffffffffffffff;
  if (sVar2 == 0xffffffffffffffff) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar2;
    sVar4 = 0xffffffffffffffff;
    if (local_40 + sVar2 <= count) {
      sVar4 = local_40 + sVar2;
    }
  }
  if ((((local_34 == tag && sVar4 != 0xffffffffffffffff) && (local_40 != 0)) &&
      (oVar1 = *der, -1 < (char)oVar1)) &&
     (((local_40 == 1 || (oVar1 != '\0')) || ((char)der[1] < '\0')))) {
    uVar5 = 0;
    if ((local_40 != 1) && (oVar1 == '\0')) {
      uVar5 = (ulong)(der[1] >> 7);
    }
    if (val != (octet *)0x0) {
      memMove(val,der + uVar5,local_40 - uVar5);
      memRev(val,local_40 - uVar5);
    }
    sVar3 = sVar4;
    if (len != (size_t *)0x0) {
      *len = local_40 - uVar5;
    }
  }
  return sVar3;
}

Assistant:

size_t derTUINTDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	size_t ex;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// установлен старший бит в первом (старшем) октете?
	// незначащий нулевой октет?
	if (l < 1 || (v[0] & 128) ||
		v[0] == 0 && l > 1 && !(v[1] & 128))
		return SIZE_MAX;
	// дополнительный нулевой октет?
	ex = (v[0] == 0 && l > 1 && (v[1] & 128)) ? 1 : 0;
	// возвратить значение
	if (val)
	{
		ASSERT(memIsValid(val, l - ex));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l - ex));
		memMove(val, v + ex, l - ex);
		memRev(val, l - ex);
	}
	// возвратить длину
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l - ex;
	}
	return count;
}